

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3PagerOpenSavepoint(Pager *pPager,int nSavepoint)

{
  u32 iSize;
  Wal *pWVar1;
  PagerSavepoint *pPVar2;
  ulong uVar3;
  Bitvec *pBVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  u32 *puVar8;
  long lVar9;
  
  if ((nSavepoint <= pPager->nSavepoint) || (pPager->useJournal == '\0')) {
    return 0;
  }
  iVar7 = pPager->nSavepoint;
  lVar9 = (long)iVar7;
  lVar6 = (long)nSavepoint;
  pPVar2 = (PagerSavepoint *)sqlite3Realloc(pPager->aSavepoint,lVar6 * 0x30);
  iVar5 = 7;
  if (pPVar2 != (PagerSavepoint *)0x0) {
    memset(pPVar2 + lVar9,0,(lVar6 - lVar9) * 0x30);
    pPager->aSavepoint = pPVar2;
    puVar8 = pPVar2[lVar9].aWalData + 3;
    for (; iVar7 = iVar7 + 1, lVar9 < lVar6; lVar9 = lVar9 + 1) {
      iSize = pPager->dbSize;
      puVar8[-5] = iSize;
      if ((pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) ||
         (uVar3 = pPager->journalOff, (long)uVar3 < 1)) {
        uVar3 = (ulong)pPager->sectorSize;
      }
      ((PagerSavepoint *)(puVar8 + -0xb))->iOffset = uVar3;
      puVar8[-4] = pPager->nSubRec;
      pBVar4 = sqlite3BitvecCreate(iSize);
      *(Bitvec **)(puVar8 + -7) = pBVar4;
      if (pBVar4 == (Bitvec *)0x0) {
        return 7;
      }
      pWVar1 = pPager->pWal;
      if (pWVar1 != (Wal *)0x0) {
        puVar8[-3] = (pWVar1->hdr).mxFrame;
        puVar8[-2] = (pWVar1->hdr).aFrameCksum[0];
        puVar8[-1] = (pWVar1->hdr).aFrameCksum[1];
        *puVar8 = pWVar1->nCkpt;
      }
      pPager->nSavepoint = iVar7;
      puVar8 = puVar8 + 0xc;
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerOpenSavepoint(Pager *pPager, int nSavepoint){
  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );

  if( nSavepoint>pPager->nSavepoint && pPager->useJournal ){
    return pagerOpenSavepoint(pPager, nSavepoint);
  }else{
    return SQLITE_OK;
  }
}